

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O0

int __thiscall Fl_Function_Type::open(Fl_Function_Type *this,char *__file,int __oflag,...)

{
  Fl_Input *this_00;
  char cVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  Fl_Class_Type *pFVar5;
  Fl_Text_Buffer *pFVar6;
  Fl_Button *pFVar7;
  Fl_Double_Window *c_00;
  char *pcVar8;
  Fl_Double_Window *__stat_loc;
  bool bVar9;
  char *local_60;
  char *pcStack_38;
  int mod;
  char *d;
  char *c_1;
  Fl_Widget *w;
  char *message;
  char *c;
  Fl_Function_Type *this_local;
  
  if (function_panel == (Fl_Double_Window *)0x0) {
    make_function_panel();
  }
  Fl_Input_::static_value(&f_return_type_input->super_Fl_Input_,this->return_type);
  this_00 = f_name_input;
  pcVar4 = Fl_Type::name(&this->super_Fl_Type);
  Fl_Input_::static_value(&this_00->super_Fl_Input_,pcVar4);
  pFVar5 = Fl_Type::is_in_class(&this->super_Fl_Type);
  if (pFVar5 == (Fl_Class_Type *)0x0) {
    Fl_Choice::value(f_public_choice,(uint)('\0' < this->public_));
    (*(f_public_choice->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[5])();
    (*(f_public_member_choice->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[6])();
  }
  else {
    Fl_Choice::value(f_public_member_choice,(int)this->public_);
    (*(f_public_member_choice->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[5])();
    (*(f_public_choice->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[6])();
  }
  Fl_Button::value(&f_c_button->super_Fl_Button,(int)this->cdecl_);
  local_60 = Fl_Type::comment(&this->super_Fl_Type);
  pFVar6 = Fl_Text_Display::buffer(&f_comment_input->super_Fl_Text_Display);
  if (local_60 == (char *)0x0) {
    local_60 = "";
  }
  Fl_Text_Buffer::text(pFVar6,local_60);
  __stat_loc = function_panel;
  (*(function_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  w = (Fl_Widget *)0x0;
LAB_0018663d:
  do {
    do {
      if (w != (Fl_Widget *)0x0) {
        __stat_loc = (Fl_Double_Window *)0x2893f1;
        fl_alert("%s");
      }
      while( true ) {
        pFVar7 = (Fl_Button *)Fl::readqueue();
        if (pFVar7 == f_panel_cancel) goto LAB_0018695c;
        if (pFVar7 == &f_panel_ok->super_Fl_Button) break;
        if (pFVar7 == (Fl_Button *)0x0) {
          Fl::wait(__stat_loc);
        }
      }
      d = Fl_Input_::value(&f_name_input->super_Fl_Input_);
      while (iVar3 = isspace((int)*d), iVar3 != 0) {
        d = d + 1;
      }
      __stat_loc = (Fl_Double_Window *)d;
      w = (Fl_Widget *)c_check(d,0);
    } while (w != (Fl_Widget *)0x0);
    for (pcStack_38 = d; *pcStack_38 != '('; pcStack_38 = pcStack_38 + 1) {
      __stat_loc = (Fl_Double_Window *)(ulong)(uint)(int)*pcStack_38;
      iVar3 = isspace((int)*pcStack_38);
      if ((iVar3 != 0) || (*pcStack_38 == '\0')) break;
    }
    if ((*d != '\0') && (*pcStack_38 != '(')) {
      w = (Fl_Widget *)anon_var_dwarf_1638;
      goto LAB_0018663d;
    }
    c_00 = (Fl_Double_Window *)Fl_Input_::value(&f_return_type_input->super_Fl_Input_);
    __stat_loc = c_00;
    w = (Fl_Widget *)c_check((char *)c_00,0);
  } while (w != (Fl_Widget *)0x0);
  pcVar4 = Fl_Input_::value(&f_name_input->super_Fl_Input_);
  Fl_Type::name(&this->super_Fl_Type,pcVar4);
  storestring((char *)c_00,&this->return_type,0);
  pFVar5 = Fl_Type::is_in_class(&this->super_Fl_Type);
  if (pFVar5 == (Fl_Class_Type *)0x0) {
    cVar2 = this->public_;
    iVar3 = Fl_Choice::value(f_public_choice);
    bVar9 = cVar2 != iVar3;
    if (bVar9) {
      iVar3 = Fl_Choice::value(f_public_choice);
      this->public_ = (char)iVar3;
      redraw_browser();
    }
  }
  else {
    cVar2 = this->public_;
    iVar3 = Fl_Choice::value(f_public_member_choice);
    bVar9 = cVar2 != iVar3;
    if (bVar9) {
      iVar3 = Fl_Choice::value(f_public_member_choice);
      this->public_ = (char)iVar3;
      redraw_browser();
    }
  }
  cVar2 = this->cdecl_;
  cVar1 = Fl_Button::value(&f_c_button->super_Fl_Button);
  if (cVar2 != cVar1) {
    bVar9 = true;
    cVar2 = Fl_Button::value(&f_c_button->super_Fl_Button);
    this->cdecl_ = cVar2;
  }
  pFVar6 = Fl_Text_Display::buffer(&f_comment_input->super_Fl_Text_Display);
  pcVar4 = Fl_Text_Buffer::text(pFVar6);
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    pcVar8 = Fl_Type::comment(&this->super_Fl_Type);
    if (pcVar8 != (char *)0x0) {
      redraw_browser();
    }
    Fl_Type::comment(&this->super_Fl_Type,(char *)0x0);
    goto LAB_00186938;
  }
  pcVar8 = Fl_Type::comment(&this->super_Fl_Type);
  if (pcVar8 == (char *)0x0) {
LAB_00186903:
    redraw_browser();
  }
  else {
    pcVar8 = Fl_Type::comment(&this->super_Fl_Type);
    iVar3 = strcmp(pcVar4,pcVar8);
    if (iVar3 != 0) goto LAB_00186903;
  }
  Fl_Type::comment(&this->super_Fl_Type,pcVar4);
LAB_00186938:
  if (pcVar4 != (char *)0x0) {
    free(pcVar4);
  }
  if (bVar9) {
    set_modflag(1);
  }
LAB_0018695c:
  iVar3 = (*(function_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
  return iVar3;
}

Assistant:

void Fl_Function_Type::open() {
  if (!function_panel) make_function_panel();
  f_return_type_input->static_value(return_type);
  f_name_input->static_value(name());
  if (is_in_class()) {
    f_public_member_choice->value(public_);
    f_public_member_choice->show();
    f_public_choice->hide();
  } else {
    f_public_choice->value(public_>0);
    f_public_choice->show();
    f_public_member_choice->hide();
  }
  f_c_button->value(cdecl_);
  const char *c = comment();
  f_comment_input->buffer()->text(c?c:"");
  function_panel->show();
  const char* message = 0;
  for (;;) { // repeat as long as there are errors
    if (message) fl_alert("%s", message);
    for (;;) {
      Fl_Widget* w = Fl::readqueue();
      if (w == f_panel_cancel) goto BREAK2;
      else if (w == f_panel_ok) break;
      else if (!w) Fl::wait();
    }
    const char*c = f_name_input->value();
    while (isspace(*c)) c++;
    message = c_check(c); if (message) continue;
    const char *d = c;
    for (; *d != '('; d++) if (isspace(*d) || !*d) break;
    if (*c && *d != '(') {
      message = "must be name(arguments), try again:"; continue;
    }
    int mod = 0;
    c = f_return_type_input->value();
    message = c_check(c); if (message) continue;
    name(f_name_input->value());
    storestring(c, return_type);
    if (is_in_class()) {
      if (public_ != f_public_member_choice->value()) {
        mod = 1;
        public_ = f_public_member_choice->value();
        redraw_browser();
      }
    } else {
      if (public_ != f_public_choice->value()) {
        mod = 1;
        public_ = f_public_choice->value();
        redraw_browser();
      }
    }
    if (cdecl_ != f_c_button->value()) {
      mod = 1;
      cdecl_ = f_c_button->value();
    }
    c = f_comment_input->buffer()->text();
    if (c && *c) {
      if (!comment() || strcmp(c, comment())) redraw_browser();
      comment(c);
    } else {
      if (comment()) redraw_browser();
      comment(0);
    }
    if (c) free((void*)c);
    if (mod) set_modflag(1);
    break;
  }
BREAK2:
  function_panel->hide();
}